

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleBase::setupLeafNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,
          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
          *values)

{
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo> *this_00;
  int iVar1;
  pointer ppVar2;
  Rep *pRVar3;
  TreeEnsembleParameters_TreeNode *pTVar4;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *obj;
  void *pvVar5;
  pair<unsigned_long,_double> *p;
  pointer ppVar6;
  
  pTVar4 = _getNode(this,treeId,nodeId,true);
  pTVar4->nodebehavior_ = 6;
  this_00 = &pTVar4->evaluationinfo_;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
            (&this_00->super_RepeatedPtrFieldBase);
  ppVar6 = (values->
           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (values->
           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar6 == ppVar2) {
      return;
    }
    pRVar3 = (pTVar4->evaluationinfo_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3 == (Rep *)0x0) {
LAB_002e2843:
      obj = google::protobuf::Arena::
            CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                      ((this_00->super_RepeatedPtrFieldBase).arena_);
      pvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                         (&this_00->super_RepeatedPtrFieldBase,obj);
    }
    else {
      iVar1 = (pTVar4->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar3->allocated_size <= iVar1) goto LAB_002e2843;
      (pTVar4->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar5 = pRVar3->elements[iVar1];
    }
    *(unsigned_long *)((long)pvVar5 + 0x10) = ppVar6->first;
    *(double *)((long)pvVar5 + 0x18) = ppVar6->second;
    ppVar6 = ppVar6 + 1;
  } while( true );
}

Assistant:

void TreeEnsembleBase::setupLeafNode(size_t treeId, size_t nodeId,
                                         const std::vector<std::pair<size_t, double> >& values) {
        Specification::TreeEnsembleParameters::TreeNode& node = _getNode(treeId, nodeId, true);

        // TODO: Error checking routines -- make sure this node hasn't been requested before.
        node.set_nodebehavior(Specification::TreeEnsembleParameters::TreeNode::LeafNode);

        node.clear_evaluationinfo();
        for(const auto& p : values) {
            auto ei = node.add_evaluationinfo();
            ei->set_evaluationindex(p.first);
            ei->set_evaluationvalue(p.second);
        }
    }